

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

ValueType OpenMesh::IO::get_property_type(string *_string1,string *_string2)

{
  int iVar1;
  ValueType VVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)_string1);
  VVar2 = ValueTypeFLOAT32;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)_string2);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)_string1);
      VVar2 = ValueTypeFLOAT64;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)_string2);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)_string1);
          VVar2 = ValueTypeFLOAT;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)_string2);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)_string1);
              VVar2 = ValueTypeDOUBLE;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)_string2);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)_string1);
                  VVar2 = ValueTypeINT8;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)_string2);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)_string1);
                      VVar2 = ValueTypeUINT8;
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)_string2);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)_string1);
                          VVar2 = ValueTypeCHAR;
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::string::compare((char *)_string2);
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::string::compare((char *)_string1);
                              VVar2 = ValueTypeUCHAR;
                              if (iVar1 != 0) {
                                iVar1 = std::__cxx11::string::compare((char *)_string2);
                                if (iVar1 != 0) {
                                  iVar1 = std::__cxx11::string::compare((char *)_string1);
                                  VVar2 = ValueTypeINT32;
                                  if (iVar1 != 0) {
                                    iVar1 = std::__cxx11::string::compare((char *)_string2);
                                    if (iVar1 != 0) {
                                      iVar1 = std::__cxx11::string::compare((char *)_string1);
                                      VVar2 = ValueTypeUINT32;
                                      if (iVar1 != 0) {
                                        iVar1 = std::__cxx11::string::compare((char *)_string2);
                                        if (iVar1 != 0) {
                                          iVar1 = std::__cxx11::string::compare((char *)_string1);
                                          VVar2 = ValueTypeINT;
                                          if (iVar1 != 0) {
                                            iVar1 = std::__cxx11::string::compare((char *)_string2);
                                            if (iVar1 != 0) {
                                              iVar1 = std::__cxx11::string::compare
                                                                ((char *)_string1);
                                              VVar2 = ValueTypeUINT;
                                              if (iVar1 != 0) {
                                                iVar1 = std::__cxx11::string::compare
                                                                  ((char *)_string2);
                                                if (iVar1 != 0) {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)_string1);
                                                  VVar2 = ValueTypeINT16;
                                                  if (iVar1 != 0) {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)_string2);
                                                    if (iVar1 != 0) {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)_string1);
                                                      VVar2 = ValueTypeUINT16;
                                                      if (iVar1 != 0) {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)_string2);
                                                        if (iVar1 != 0) {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)_string1);
                                                          VVar2 = ValueTypeSHORT;
                                                          if (iVar1 != 0) {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)_string2);
                                                            if (iVar1 != 0) {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)_string1);
                                                              if (iVar1 == 0) {
                                                                VVar2 = ValueTypeUSHORT;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)_string2);
                                                                VVar2 = (uint)(iVar1 == 0) << 3;
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return VVar2;
}

Assistant:

_PLYReader_::ValueType get_property_type(std::string _string1, std::string _string2) {

    if (_string1 == "float32" || _string2 == "float32")

        return _PLYReader_::ValueTypeFLOAT32;

    else if (_string1 == "float64" || _string2 == "float64")

        return _PLYReader_::ValueTypeFLOAT64;

    else if (_string1 == "float" || _string2 == "float")

        return _PLYReader_::ValueTypeFLOAT;

    else if (_string1 == "double" || _string2 == "double")

        return _PLYReader_::ValueTypeDOUBLE;

    else if (_string1 == "int8" || _string2 == "int8")

        return _PLYReader_::ValueTypeINT8;

    else if (_string1 == "uint8" || _string2 == "uint8")

        return _PLYReader_::ValueTypeUINT8;

    else if (_string1 == "char" || _string2 == "char")

        return _PLYReader_::ValueTypeCHAR;

    else if (_string1 == "uchar" || _string2 == "uchar")

        return _PLYReader_::ValueTypeUCHAR;

    else if (_string1 == "int32" || _string2 == "int32")

        return _PLYReader_::ValueTypeINT32;

    else if (_string1 == "uint32" || _string2 == "uint32")

        return _PLYReader_::ValueTypeUINT32;

    else if (_string1 == "int" || _string2 == "int")

        return _PLYReader_::ValueTypeINT;

    else if (_string1 == "uint" || _string2 == "uint")

        return _PLYReader_::ValueTypeUINT;

    else if (_string1 == "int16" || _string2 == "int16")

        return _PLYReader_::ValueTypeINT16;

    else if (_string1 == "uint16" || _string2 == "uint16")

        return _PLYReader_::ValueTypeUINT16;

    else if (_string1 == "short" || _string2 == "short")

        return _PLYReader_::ValueTypeSHORT;

    else if (_string1 == "ushort" || _string2 == "ushort")

        return _PLYReader_::ValueTypeUSHORT;

    return _PLYReader_::Unsupported;
}